

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getRedCost(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SoPlexBase<double> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  
  bVar1 = hasSol(in_RDI);
  if (bVar1) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x44a5ed);
    iVar3 = numCols((SoPlexBase<double> *)0x44a5fb);
    if (iVar3 <= iVar2) {
      _syncRealSolution(in_RDI);
      SolBase<double>::getRedCostSol
                ((SolBase<double> *)in_RDI,
                 (VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      return true;
    }
  }
  return false;
}

Assistant:

bool SoPlexBase<R>::getRedCost(VectorBase<R>& vector)
{
   if(hasSol() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getRedCostSol(vector);
      return true;
   }
   else
      return false;
}